

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O1

void ucnv_MBCSGetStarters(UConverter *cnv,UBool *starters,UErrorCode *param_3)

{
  byte bVar1;
  int32_t (*paiVar2) [256];
  long lVar3;
  
  bVar1 = (cnv->sharedData->mbcs).dbcsOnlyState;
  paiVar2 = (cnv->sharedData->mbcs).stateTable;
  lVar3 = 0;
  do {
    starters[lVar3] = -1 < paiVar2[bVar1][lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  return;
}

Assistant:

static void U_CALLCONV
ucnv_MBCSGetStarters(const UConverter* cnv,
                 UBool starters[256],
                 UErrorCode *) {
    const int32_t *state0;
    int i;

    state0=cnv->sharedData->mbcs.stateTable[cnv->sharedData->mbcs.dbcsOnlyState];
    for(i=0; i<256; ++i) {
        /* all bytes that cause a state transition from state 0 are lead bytes */
        starters[i]= (UBool)MBCS_ENTRY_IS_TRANSITION(state0[i]);
    }
}